

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O0

void SetImplicitArgs(TArray<PType_*,_PType_*> *args,TArray<unsigned_int,_unsigned_int> *argflags,
                    PClassActor *cls,DWORD funcflags)

{
  TArray<unsigned_int,_unsigned_int> *pTVar1;
  uint uVar2;
  bool bVar3;
  uint local_50 [2];
  PType *local_48;
  PClassPointer *local_40;
  uint local_34;
  PClassPointer *local_30;
  DWORD local_24;
  PClassActor *pPStack_20;
  DWORD funcflags_local;
  PClassActor *cls_local;
  TArray<unsigned_int,_unsigned_int> *argflags_local;
  TArray<PType_*,_PType_*> *args_local;
  
  bVar3 = true;
  local_24 = funcflags;
  pPStack_20 = cls;
  cls_local = (PClassActor *)argflags;
  argflags_local = (TArray<unsigned_int,_unsigned_int> *)args;
  if (args != (TArray<PType_*,_PType_*> *)0x0) {
    uVar2 = TArray<PType_*,_PType_*>::Size(args);
    bVar3 = uVar2 == 0;
  }
  if (!bVar3) {
    __assert_fail("args == NULL || args->Size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                  ,0x1a0,
                  "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, PClassActor *, DWORD)");
  }
  bVar3 = true;
  if (cls_local != (PClassActor *)0x0) {
    uVar2 = TArray<unsigned_int,_unsigned_int>::Size
                      ((TArray<unsigned_int,_unsigned_int> *)cls_local);
    bVar3 = uVar2 == 0;
  }
  pTVar1 = argflags_local;
  if (bVar3) {
    if ((local_24 & 2) != 0) {
      if (argflags_local != (TArray<unsigned_int,_unsigned_int> *)0x0) {
        local_30 = NewClassPointer(&pPStack_20->super_PClass);
        TArray<PType_*,_PType_*>::Push((TArray<PType_*,_PType_*> *)pTVar1,(PType **)&local_30);
      }
      if (cls_local != (PClassActor *)0x0) {
        local_34 = 0;
        TArray<unsigned_int,_unsigned_int>::Push
                  ((TArray<unsigned_int,_unsigned_int> *)cls_local,&local_34);
      }
    }
    pTVar1 = argflags_local;
    if ((local_24 & 4) != 0) {
      if (argflags_local != (TArray<unsigned_int,_unsigned_int> *)0x0) {
        local_40 = NewClassPointer(AActor::RegistrationInfo.MyClass);
        TArray<PType_*,_PType_*>::Push((TArray<PType_*,_PType_*> *)pTVar1,(PType **)&local_40);
        local_48 = (PType *)TypeState;
        TArray<PType_*,_PType_*>::Push((TArray<PType_*,_PType_*> *)argflags_local,&local_48);
      }
      if (cls_local != (PClassActor *)0x0) {
        local_50[1] = 0;
        TArray<unsigned_int,_unsigned_int>::Push
                  ((TArray<unsigned_int,_unsigned_int> *)cls_local,local_50 + 1);
        local_50[0] = 0;
        TArray<unsigned_int,_unsigned_int>::Push
                  ((TArray<unsigned_int,_unsigned_int> *)cls_local,local_50);
      }
    }
    return;
  }
  __assert_fail("argflags == NULL || argflags->Size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                ,0x1a1,
                "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, PClassActor *, DWORD)");
}

Assistant:

void SetImplicitArgs(TArray<PType *> *args, TArray<DWORD> *argflags, PClassActor *cls, DWORD funcflags)
{
	// Must be called before adding any other arguments.
	assert(args == NULL || args->Size() == 0);
	assert(argflags == NULL || argflags->Size() == 0);

	if (funcflags & VARF_Method)
	{
		// implied self pointer
		if (args != NULL)		args->Push(NewClassPointer(cls));
		if (argflags != NULL)	argflags->Push(0);
	}
	if (funcflags & VARF_Action)
	{
		// implied stateowner and callingstate pointers
		if (args != NULL)
		{
			args->Push(NewClassPointer(RUNTIME_CLASS(AActor)));
			args->Push(TypeState);
		}
		if (argflags != NULL)
		{
			argflags->Push(0);
			argflags->Push(0);
		}
	}
}